

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

bool __thiscall choc::value::Type::ComplexArray::usesStrings(ComplexArray *this)

{
  MainType MVar1;
  RepeatedGroup *pRVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  uVar4 = (ulong)(this->groups).size;
  bVar6 = uVar4 != 0;
  if (bVar6) {
    pRVar2 = (this->groups).items;
    lVar5 = 0;
    do {
      MVar1 = (&(pRVar2->elementType).mainType)[lVar5];
      if (MVar1 == object) {
        bVar3 = Object::usesStrings(*(Object **)((long)&(pRVar2->elementType).content + lVar5));
        if (bVar3) {
          return bVar6;
        }
      }
      else if (MVar1 == string) {
        return bVar6;
      }
      lVar5 = lVar5 + 0x28;
      bVar6 = uVar4 * 0x28 != lVar5;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

ObjectType* end() const                     { return items + size; }